

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O3

double __thiscall PFData::fileReadPoint(PFData *this,int z,int y,int x)

{
  int iVar1;
  long __off;
  size_t sVar2;
  double dVar3;
  fpos_t pos;
  uint64_t buf;
  fpos_t local_38;
  uint64_t local_28;
  
  local_38.__pos = 0;
  local_38.__state.__count = 0;
  local_38.__state.__value = (_union_27)0x0;
  fgetpos((FILE *)this->m_fp,&local_38);
  __off = getPointOffset(this,z,y,x);
  iVar1 = fseek((FILE *)this->m_fp,__off,0);
  if (iVar1 != 0) {
    perror("Error seeking to file");
  }
  sVar2 = fread(&local_28,8,1,(FILE *)this->m_fp);
  dVar3 = (double)bswap64(local_28);
  if ((int)sVar2 != 1) {
    perror("Error reading double");
  }
  fsetpos((FILE *)this->m_fp,&local_38);
  return dVar3;
}

Assistant:

double PFData::fileReadPoint(int z, int y, int x){
    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);

    const long offset = getPointOffset(z, y, x);
    if(std::fseek(m_fp, offset, SEEK_SET)){
        std::perror("Error seeking to file");
    }

    double data = 0;
    int err = 0;
    READDOUBLE(data, m_fp, err);
    if(1 != err){
        std::perror("Error reading double");
    }

    //Restore old position
    std::fsetpos(m_fp, &pos);

    return data;
}